

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::CheckPropertyCompatibility
          (cmGeneratorTarget *this,cmComputeLinkInformation *info,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pIVar2;
  cmLocalGenerator *this_00;
  bool bVar3;
  int iVar4;
  ItemVector *pIVar5;
  iterator iVar6;
  ostream *poVar7;
  string *psVar8;
  size_type sVar9;
  Item *dep;
  pointer pIVar10;
  string prop;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string propsString;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedMaxNumbers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedMinNumbers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedStrings;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedBools;
  string result_1;
  
  pIVar5 = cmComputeLinkInformation::GetItems(info);
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedBools._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedBools._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
      strBool_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                 ::strBool_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strBool_abi_cxx11_,"COMPATIBLE_INTERFACE_BOOL",(allocator<char> *)&result_1);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strBool_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                           ::strBool_abi_cxx11_);
    }
  }
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
      strString_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                 ::strString_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strString_abi_cxx11_,"COMPATIBLE_INTERFACE_STRING",(allocator<char> *)&result_1)
      ;
      __cxa_atexit(std::__cxx11::string::~string,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                           ::strString_abi_cxx11_);
    }
  }
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedMinNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
      strNumMin_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                 ::strNumMin_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMin_abi_cxx11_,"COMPATIBLE_INTERFACE_NUMBER_MIN",
                 (allocator<char> *)&result_1);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strNumMin_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                           ::strNumMin_abi_cxx11_);
    }
  }
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
      strNumMax_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                 ::strNumMax_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMax_abi_cxx11_,"COMPATIBLE_INTERFACE_NUMBER_MAX",
                 (allocator<char> *)&result_1);
      __cxa_atexit(std::__cxx11::string::~string,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strNumMax_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                           ::strNumMax_abi_cxx11_);
    }
  }
  pIVar2 = (pIVar5->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar10 = (pIVar5->
                 super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 )._M_impl.super__Vector_impl_data._M_start; pIVar10 != pIVar2;
      pIVar10 = pIVar10 + 1) {
    if (pIVar10->Target != (cmGeneratorTarget *)0x0) {
      checkPropertyConsistency<bool>
                (this,pIVar10->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strBool_abi_cxx11_,&emittedBools,config,BoolType,(bool *)0x0);
      bVar3 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar3) goto LAB_00304983;
      checkPropertyConsistency<char_const*>
                (this,pIVar10->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strString_abi_cxx11_,&emittedStrings,config,StringType,(char **)0x0);
      bVar3 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar3) goto LAB_00304983;
      checkPropertyConsistency<char_const*>
                (this,pIVar10->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMin_abi_cxx11_,&emittedMinNumbers,config,NumberMinType,(char **)0x0);
      bVar3 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar3) goto LAB_00304983;
      checkPropertyConsistency<char_const*>
                (this,pIVar10->Target,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMax_abi_cxx11_,&emittedMaxNumbers,config,NumberMaxType,(char **)0x0);
      bVar3 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar3) goto LAB_00304983;
    }
  }
  paVar1 = &result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)paVar1;
  intersect(&result_1,&emittedBools,&emittedStrings);
  std::__cxx11::string::operator=((string *)&result,(string *)&result_1);
  std::__cxx11::string::~string((string *)&result_1);
  sVar9 = result._M_string_length;
  if (result._M_string_length == 0) {
    intersect(&result_1,&emittedBools,&emittedMinNumbers);
    std::__cxx11::string::operator=((string *)&result,(string *)&result_1);
    std::__cxx11::string::~string((string *)&result_1);
    sVar9 = result._M_string_length;
    if (result._M_string_length == 0) {
      intersect(&result_1,&emittedBools,&emittedMaxNumbers);
      std::__cxx11::string::operator=((string *)&result,(string *)&result_1);
      std::__cxx11::string::~string((string *)&result_1);
      sVar9 = result._M_string_length;
      if (result._M_string_length == 0) {
        paVar1 = &result_1.field_2;
        result_1._M_string_length = 0;
        result_1.field_2._M_local_buf[0] = '\0';
        result_1._M_dataplus._M_p = (pointer)paVar1;
        intersect(&propsString,&emittedStrings,&emittedMinNumbers);
        std::__cxx11::string::operator=((string *)&result_1,(string *)&propsString);
        std::__cxx11::string::~string((string *)&propsString);
        sVar9 = result_1._M_string_length;
        if (result_1._M_string_length == 0) {
          intersect(&propsString,&emittedStrings,&emittedMaxNumbers);
          std::__cxx11::string::operator=((string *)&result_1,(string *)&propsString);
          std::__cxx11::string::~string((string *)&propsString);
          sVar9 = result_1._M_string_length;
          if (result_1._M_string_length != 0) goto LAB_00304a67;
          intersect(&prop,&emittedMinNumbers,&emittedMaxNumbers);
        }
        else {
LAB_00304a67:
          prop._M_dataplus._M_p = (pointer)&prop.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result_1._M_dataplus._M_p == paVar1) {
            prop.field_2._8_8_ = result_1.field_2._8_8_;
          }
          else {
            prop._M_dataplus = result_1._M_dataplus;
          }
          prop.field_2._M_allocated_capacity._1_7_ = result_1.field_2._M_allocated_capacity._1_7_;
          prop.field_2._M_local_buf[0] = result_1.field_2._M_local_buf[0];
          result_1._M_string_length = 0;
          result_1.field_2._M_local_buf[0] = '\0';
          prop._M_string_length = sVar9;
          result_1._M_dataplus._M_p = (pointer)paVar1;
        }
        std::__cxx11::string::~string((string *)&result_1);
        goto LAB_0030474d;
      }
    }
  }
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p == paVar1) {
    prop.field_2._8_8_ = result.field_2._8_8_;
  }
  else {
    prop._M_dataplus = result._M_dataplus;
  }
  prop.field_2._M_allocated_capacity._1_7_ = result.field_2._M_allocated_capacity._1_7_;
  prop.field_2._M_local_buf[0] = result.field_2._M_local_buf[0];
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  prop._M_string_length = sVar9;
  result._M_dataplus._M_p = (pointer)paVar1;
LAB_0030474d:
  std::__cxx11::string::~string((string *)&result);
  if (prop._M_string_length != 0) {
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    props.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&emittedBools._M_t,&prop);
    if ((_Rb_tree_header *)iVar6._M_node != &emittedBools._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&props,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strBool_abi_cxx11_);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&emittedStrings._M_t,&prop);
    if ((_Rb_tree_header *)iVar6._M_node != &emittedStrings._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&props,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strString_abi_cxx11_);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&emittedMinNumbers._M_t,&prop);
    if ((_Rb_tree_header *)iVar6._M_node != &emittedMinNumbers._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&props,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strNumMin_abi_cxx11_);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&emittedMaxNumbers._M_t,&prop);
    if ((_Rb_tree_header *)iVar6._M_node != &emittedMaxNumbers._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&props,&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strNumMax_abi_cxx11_);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    result_1._M_string_length =
         (size_type)
         (props.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1);
    result_1._M_dataplus._M_p =
         (pointer)props.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&propsString,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&result_1,", ");
    std::operator+(&result_1," and the ",
                   props.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::__cxx11::string::append((string *)&propsString);
    std::__cxx11::string::~string((string *)&result_1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&result_1);
    poVar7 = std::operator<<((ostream *)&result_1,"Property \"");
    poVar7 = std::operator<<(poVar7,(string *)&prop);
    poVar7 = std::operator<<(poVar7,"\" appears in both the ");
    poVar7 = std::operator<<(poVar7,(string *)&propsString);
    poVar7 = std::operator<<(poVar7," property in the dependencies of target \"");
    psVar8 = GetName_abi_cxx11_(this);
    poVar7 = std::operator<<(poVar7,(string *)psVar8);
    std::operator<<(poVar7,
                    "\".  This is not allowed. A property may only require compatibility in a boolean interpretation, a numeric minimum, a numeric maximum or a string interpretation, but not a mixture."
                   );
    this_00 = this->LocalGenerator;
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result_1);
    std::__cxx11::string::~string((string *)&propsString);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&props);
  }
  std::__cxx11::string::~string((string *)&prop);
LAB_00304983:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedMaxNumbers._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedMinNumbers._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedStrings._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emittedBools._M_t);
  return;
}

Assistant:

void cmGeneratorTarget::CheckPropertyCompatibility(
  cmComputeLinkInformation* info, const std::string& config) const
{
  const cmComputeLinkInformation::ItemVector& deps = info->GetItems();

  std::set<std::string> emittedBools;
  static const std::string strBool = "COMPATIBLE_INTERFACE_BOOL";
  std::set<std::string> emittedStrings;
  static const std::string strString = "COMPATIBLE_INTERFACE_STRING";
  std::set<std::string> emittedMinNumbers;
  static const std::string strNumMin = "COMPATIBLE_INTERFACE_NUMBER_MIN";
  std::set<std::string> emittedMaxNumbers;
  static const std::string strNumMax = "COMPATIBLE_INTERFACE_NUMBER_MAX";

  for (auto const& dep : deps) {
    if (!dep.Target) {
      continue;
    }

    checkPropertyConsistency<bool>(this, dep.Target, strBool, emittedBools,
                                   config, BoolType, nullptr);
    if (cmSystemTools::GetErrorOccuredFlag()) {
      return;
    }
    checkPropertyConsistency<const char*>(this, dep.Target, strString,
                                          emittedStrings, config, StringType,
                                          nullptr);
    if (cmSystemTools::GetErrorOccuredFlag()) {
      return;
    }
    checkPropertyConsistency<const char*>(this, dep.Target, strNumMin,
                                          emittedMinNumbers, config,
                                          NumberMinType, nullptr);
    if (cmSystemTools::GetErrorOccuredFlag()) {
      return;
    }
    checkPropertyConsistency<const char*>(this, dep.Target, strNumMax,
                                          emittedMaxNumbers, config,
                                          NumberMaxType, nullptr);
    if (cmSystemTools::GetErrorOccuredFlag()) {
      return;
    }
  }

  std::string prop = intersect(emittedBools, emittedStrings, emittedMinNumbers,
                               emittedMaxNumbers);

  if (!prop.empty()) {
    // Use a sorted std::vector to keep the error message sorted.
    std::vector<std::string> props;
    std::set<std::string>::const_iterator i = emittedBools.find(prop);
    if (i != emittedBools.end()) {
      props.push_back(strBool);
    }
    i = emittedStrings.find(prop);
    if (i != emittedStrings.end()) {
      props.push_back(strString);
    }
    i = emittedMinNumbers.find(prop);
    if (i != emittedMinNumbers.end()) {
      props.push_back(strNumMin);
    }
    i = emittedMaxNumbers.find(prop);
    if (i != emittedMaxNumbers.end()) {
      props.push_back(strNumMax);
    }
    std::sort(props.begin(), props.end());

    std::string propsString = cmJoin(cmMakeRange(props).retreat(1), ", ");
    propsString += " and the " + props.back();

    std::ostringstream e;
    e << "Property \"" << prop << "\" appears in both the " << propsString
      << " property in the dependencies of target \"" << this->GetName()
      << "\".  This is not allowed. A property may only require compatibility "
         "in a boolean interpretation, a numeric minimum, a numeric maximum "
         "or a "
         "string interpretation, but not a mixture.";
    this->LocalGenerator->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }
}